

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

x86_reg X86_insn_reg_att(uint id)

{
  insn_reg *piVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x5c) {
      return X86_REG_INVALID;
    }
    piVar1 = insn_regs_att + lVar2;
    lVar2 = lVar2 + 1;
  } while (piVar1->insn != id);
  return *(x86_reg *)(&UNK_0024497c + lVar2 * 8);
}

Assistant:

x86_reg X86_insn_reg_att(unsigned int id)
{
	unsigned int i;

	for (i = 0; i < ARR_SIZE(insn_regs_att); i++) {
		if (insn_regs_att[i].insn == id) {
			return insn_regs_att[i].reg;
		}
	}

	// not found
	return 0;
}